

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_dimension_add_t1stem
                   (PS_Dimension dim,FT_Int pos,FT_Int len,FT_Memory memory,FT_UInt *aindex)

{
  FT_Error FVar1;
  PS_Hint local_48;
  PS_Hint hint;
  FT_UInt max;
  FT_UInt idx;
  PS_Mask mask;
  FT_UInt flags;
  FT_Error error;
  FT_UInt *aindex_local;
  FT_Memory memory_local;
  FT_Int len_local;
  FT_Int pos_local;
  PS_Dimension dim_local;
  
  mask._4_4_ = 0;
  mask._0_4_ = 0;
  memory_local._0_4_ = len;
  memory_local._4_4_ = pos;
  if (len < 0) {
    mask._0_4_ = 1;
    if (len == -0x15) {
      mask._0_4_ = 3;
      memory_local._4_4_ = pos + -0x15;
    }
    memory_local._0_4_ = 0;
  }
  hint._0_4_ = (dim->hints).num_hints;
  local_48 = (dim->hints).hints;
  hint._4_4_ = 0;
  for (; (hint._4_4_ < (uint)hint &&
         ((local_48->pos != memory_local._4_4_ || (local_48->len != (FT_Int)memory_local))));
      local_48 = local_48 + 1) {
    hint._4_4_ = hint._4_4_ + 1;
  }
  _flags = aindex;
  aindex_local = (FT_UInt *)memory;
  _len_local = dim;
  if ((uint)hint <= hint._4_4_) {
    FVar1 = ps_hint_table_alloc(&dim->hints,memory,&local_48);
    if (FVar1 != 0) {
      return FVar1;
    }
    local_48->pos = memory_local._4_4_;
    local_48->len = (FT_Int)memory_local;
    local_48->flags = (FT_UInt)mask;
  }
  mask._4_4_ = 0;
  mask._4_4_ = ps_mask_table_last(&_len_local->masks,(FT_Memory)aindex_local,(PS_Mask *)&max);
  if (((mask._4_4_ == 0) &&
      (mask._4_4_ = ps_mask_set_bit(_max,hint._4_4_,(FT_Memory)aindex_local), mask._4_4_ == 0)) &&
     (_flags != (FT_UInt *)0x0)) {
    *_flags = hint._4_4_;
  }
  return mask._4_4_;
}

Assistant:

static FT_Error
  ps_dimension_add_t1stem( PS_Dimension  dim,
                           FT_Int        pos,
                           FT_Int        len,
                           FT_Memory     memory,
                           FT_UInt      *aindex )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   flags = 0;


    /* detect ghost stem */
    if ( len < 0 )
    {
      flags |= PS_HINT_FLAG_GHOST;
      if ( len == -21 )
      {
        flags |= PS_HINT_FLAG_BOTTOM;
        pos    = ADD_INT( pos, len );
      }
      len = 0;
    }

    /* now, lookup stem in the current hints table */
    {
      PS_Mask  mask;
      FT_UInt  idx;
      FT_UInt  max  = dim->hints.num_hints;
      PS_Hint  hint = dim->hints.hints;


      for ( idx = 0; idx < max; idx++, hint++ )
      {
        if ( hint->pos == pos && hint->len == len )
          break;
      }

      /* we need to create a new hint in the table */
      if ( idx >= max )
      {
        error = ps_hint_table_alloc( &dim->hints, memory, &hint );
        if ( error )
          goto Exit;

        hint->pos   = pos;
        hint->len   = len;
        hint->flags = flags;
      }

      /* now, store the hint in the current mask */
      error = ps_mask_table_last( &dim->masks, memory, &mask );
      if ( error )
        goto Exit;

      error = ps_mask_set_bit( mask, idx, memory );
      if ( error )
        goto Exit;

      if ( aindex )
        *aindex = idx;
    }

  Exit:
    return error;
  }